

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_ack(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  char cVar1;
  int iVar2;
  uint64_t start;
  quicly_ranges_t *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int ret;
  st_quicly_pn_space_t *space;
  quicly_conn_t *conn;
  uint64_t end;
  undefined4 in_stack_ffffffffffffffe0;
  
  start = in_RDI - 0x630;
  if (in_EDX != 0) {
    cVar1 = *(char *)(in_RSI + 0x10);
    if (cVar1 == '\0') {
      end = *(uint64_t *)(in_RDI + -0x100);
    }
    else if (cVar1 == '\x02') {
      end = *(uint64_t *)(in_RDI + -0xf8);
    }
    else {
      if (cVar1 != '\x03') {
        __assert_fail("!\"FIXME\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x9dd,
                      "int on_ack_ack(quicly_sentmap_t *, const quicly_sent_packet_t *, int, quicly_sent_t *)"
                     );
      }
      end = *(uint64_t *)(in_RDI + -0xf0);
    }
    iVar2 = quicly_ranges_subtract(in_RCX,start,end);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (*(long *)(end + 8) == 0) {
      *(undefined8 *)(end + 0x28) = 0x7fffffffffffffff;
      *(undefined4 *)(end + 0x38) = 0;
    }
    else if (0x40 < *(ulong *)(end + 8)) {
      quicly_ranges_drop_by_range_indices
                ((quicly_ranges_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),(size_t)in_RCX,start)
      ;
    }
  }
  return 0;
}

Assistant:

static int on_ack_ack(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));

    /* TODO log */

    if (acked) {
        /* find the pn space */
        struct st_quicly_pn_space_t *space;
        switch (packet->ack_epoch) {
        case QUICLY_EPOCH_INITIAL:
            space = &conn->initial->super;
            break;
        case QUICLY_EPOCH_HANDSHAKE:
            space = &conn->handshake->super;
            break;
        case QUICLY_EPOCH_1RTT:
            space = &conn->application->super;
            break;
        default:
            assert(!"FIXME");
            return QUICLY_TRANSPORT_ERROR_INTERNAL;
        }
        /* subtract given ACK range, then make adjustments */
        int ret;
        if ((ret = quicly_ranges_subtract(&space->ack_queue, sent->data.ack.range.start, sent->data.ack.range.end)) != 0)
            return ret;
        if (space->ack_queue.num_ranges == 0) {
            space->largest_pn_received_at = INT64_MAX;
            space->unacked_count = 0;
        } else if (space->ack_queue.num_ranges > QUICLY_MAX_ACK_BLOCKS) {
            quicly_ranges_drop_by_range_indices(&space->ack_queue, space->ack_queue.num_ranges - QUICLY_MAX_ACK_BLOCKS,
                                                space->ack_queue.num_ranges);
        }
    }

    return 0;
}